

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RectMatrix.hpp
# Opt level: O2

ostream * OpenMD::operator<<(ostream *o,RectMatrix<double,_3U,_3U> *m)

{
  ostream *poVar1;
  uint i;
  long lVar2;
  uint j;
  long lVar3;
  
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    std::operator<<(o,"(");
    for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
      std::ostream::_M_insert<double>((*(double (*) [3])*(double (*) [3])m)[lVar3]);
      if (lVar3 != 2) {
        std::operator<<(o,"\t");
      }
    }
    poVar1 = std::operator<<(o,")");
    std::endl<char,std::char_traits<char>>(poVar1);
    m = (RectMatrix<double,_3U,_3U> *)((long)m + 0x18);
  }
  return o;
}

Assistant:

std::ostream& operator<<(std::ostream& o,
                           const RectMatrix<Real, Row, Col>& m) {
    for (unsigned int i = 0; i < Row; i++) {
      o << "(";
      for (unsigned int j = 0; j < Col; j++) {
        o << m(i, j);
        if (j != Col - 1) o << "\t";
      }
      o << ")" << std::endl;
    }
    return o;
  }